

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O1

void __thiscall deci_FlexLexer::yy_delete_buffer(deci_FlexLexer *this,YY_BUFFER_STATE b)

{
  yy_buffer_state **ppyVar1;
  YY_BUFFER_STATE pyVar2;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    ppyVar1 = this->yy_buffer_stack;
    if (ppyVar1 == (yy_buffer_state **)0x0) {
      pyVar2 = (YY_BUFFER_STATE)0x0;
    }
    else {
      pyVar2 = ppyVar1[this->yy_buffer_stack_top];
    }
    if (pyVar2 == b) {
      ppyVar1[this->yy_buffer_stack_top] = (yy_buffer_state *)0x0;
    }
    if (b->yy_is_our_buffer != 0) {
      free(b->yy_ch_buf);
    }
    free(b);
    return;
  }
  return;
}

Assistant:

void yyFlexLexer::yy_delete_buffer( YY_BUFFER_STATE b )
{
    
	if ( ! b )
		return;

	if ( b == YY_CURRENT_BUFFER ) /* Not sure if we should pop here. */
		YY_CURRENT_BUFFER_LVALUE = (YY_BUFFER_STATE) 0;

	if ( b->yy_is_our_buffer )
		yyfree( (void *) b->yy_ch_buf  );

	yyfree( (void *) b  );
}